

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O2

int __thiscall iDynTree::Model::copy(Model *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  uint uVar1;
  ulong uVar2;
  size_t sVar3;
  LinkIndex linkIndex;
  SensorsList *pSVar4;
  ulong frameIndex;
  string frameName;
  string linkName;
  Transform link_H_frame;
  Transform local_90 [96];
  
  this->defaultBaseLink = LINK_INVALID_INDEX;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->packageDirs,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(dst + 200));
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)((*(long *)(dst + 0x10) - *(long *)(dst + 8)) / 0x70) <= uVar2) break;
    addLink(this,(string *)(uVar2 * 0x20 + *(long *)(dst + 0x68)),
            (Link *)(*(long *)(dst + 8) + uVar2 * 0x70));
    uVar1 = uVar1 + 1;
  }
  this->nrOfPosCoords = 0;
  this->nrOfDOFs = 0;
  uVar1 = 0;
  while( true ) {
    uVar2 = (ulong)uVar1;
    if ((ulong)(*(long *)(dst + 0x28) - *(long *)(dst + 0x20) >> 3) <= uVar2) break;
    addJoint(this,(string *)(uVar2 * 0x20 + *(long *)(dst + 0x80)),
             *(IJointConstPtr *)(*(long *)(dst + 0x20) + uVar2 * 8));
    uVar1 = uVar1 + 1;
  }
  uVar2 = (*(long *)(dst + 0x10) - *(long *)(dst + 8)) / 0x70;
  while( true ) {
    frameIndex = uVar2 & 0xffffffff;
    sVar3 = getNrOfFrames((Model *)dst);
    if (sVar3 <= frameIndex) break;
    linkIndex = getFrameLink((Model *)dst,frameIndex);
    getLinkName_abi_cxx11_(&linkName,(Model *)dst,linkIndex);
    getFrameName_abi_cxx11_(&frameName,(Model *)dst,frameIndex);
    getFrameTransform((Model *)&link_H_frame,(FrameIndex)dst);
    iDynTree::Transform::Transform(local_90,&link_H_frame);
    addAdditionalFrameToLink(this,&linkName,&frameName,local_90);
    std::__cxx11::string::~string((string *)&frameName);
    std::__cxx11::string::~string((string *)&linkName);
    uVar2 = (ulong)((int)uVar2 + 1);
  }
  setDefaultBaseLink(this,*(LinkIndex *)(dst + 0xe0));
  ModelSolidShapes::operator=(&this->m_collisionSolidShapes,(ModelSolidShapes *)(dst + 0x108));
  ModelSolidShapes::operator=(&this->m_visualSolidShapes,(ModelSolidShapes *)(dst + 0xf0));
  pSVar4 = SensorsList::operator=(&this->m_sensors,(SensorsList *)(dst + 0x120));
  return (int)pSVar4;
}

Assistant:

void Model::copy(const Model& other)
{
    // reset the base link, the real one will be copied later
    this->defaultBaseLink = LINK_INVALID_INDEX;

    this->packageDirs = other.packageDirs;

    // Add all the links, preserving the numbering
    for(unsigned int lnk=0; lnk < other.getNrOfLinks(); lnk++ )
    {
        this->addLink(other.linkNames[lnk],other.links[lnk]);
    }

    // Add all joints, preserving the numbering
    // reset the nrOfDOFs (it will be then update in addJoint)
    nrOfPosCoords = 0;
    nrOfDOFs = 0;

    for(unsigned int jnt=0; jnt < other.getNrOfJoints(); jnt++ )
    {
        this->addJoint(other.jointNames[jnt],other.joints[jnt]);
    }

    // Add all additional frames, preserving the numbering
    for(unsigned int addFrm=other.getNrOfLinks(); addFrm < other.getNrOfFrames(); addFrm++ )
    {
        std::string linkName = other.getLinkName(other.getFrameLink(addFrm));
        std::string frameName = other.getFrameName(addFrm);
        Transform link_H_frame = other.getFrameTransform(addFrm);
        this->addAdditionalFrameToLink(linkName,frameName,link_H_frame);
    }

    // Copy the default base link
    this->setDefaultBaseLink(other.getDefaultBaseLink());

    // Copy the solid shapes
    this->m_collisionSolidShapes = other.m_collisionSolidShapes;
    this->m_visualSolidShapes    = other.m_visualSolidShapes;

    // Copy the sensors
    this->m_sensors = other.m_sensors;
}